

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_split_internal.h
# Opt level: O0

vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
* __thiscall
absl::lts_20250127::strings_internal::
Splitter<absl::lts_20250127::ByAnyChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
::
ConvertToContainer<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
::operator()(vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             *__return_storage_ptr__,
            ConvertToContainer<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
            *this,Splitter<absl::lts_20250127::ByAnyChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
                  *splitter)

{
  bool bVar1;
  pointer pvVar2;
  const_pointer pvVar3;
  reference pvVar4;
  size_type sVar5;
  size_type sVar6;
  iterator __first;
  iterator pvVar7;
  byte local_1e1;
  __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  local_1a0;
  const_iterator local_198;
  size_type local_190;
  size_t index;
  undefined1 local_178 [8];
  const_iterator it;
  array<raw_view,_16UL> ar;
  Splitter<absl::lts_20250127::ByAnyChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *splitter_local;
  ConvertToContainer<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
  *this_local;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *v;
  
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(__return_storage_ptr__);
  Splitter<absl::lts_20250127::ByAnyChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::begin((const_iterator *)local_178,splitter);
  while (bVar1 = SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByAnyChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::at_end((SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByAnyChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           *)local_178), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_190 = 0;
    do {
      pvVar2 = SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByAnyChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::operator->((SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByAnyChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             *)local_178);
      pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data(pvVar2);
      pvVar4 = std::array<raw_view,_16UL>::operator[]
                         ((array<raw_view,_16UL> *)&it.field_0x48,local_190);
      pvVar4->data = pvVar3;
      pvVar2 = SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByAnyChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::operator->((SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByAnyChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             *)local_178);
      sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size(pvVar2);
      pvVar4 = std::array<raw_view,_16UL>::operator[]
                         ((array<raw_view,_16UL> *)&it.field_0x48,local_190);
      pvVar4->size = sVar5;
      SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByAnyChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::operator++((SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByAnyChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *)local_178);
      sVar5 = local_190 + 1;
      local_190 = sVar5;
      sVar6 = std::
              array<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByAnyChar,absl::lts_20250127::SkipEmpty,std::basic_string_view<char,std::char_traits<char>>>::ConvertToContainer<std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>,std::basic_string_view<char,std::char_traits<char>>,false>::TEMPNAMEPLACEHOLDERVALUE(absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByAnyChar,absl::lts_20250127::SkipEmpty,std::basic_string_view<char,std::char_traits<char>>>const&)const::raw_view,16ul>
              ::operator()((array<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByAnyChar,absl::lts_20250127::SkipEmpty,std::basic_string_view<char,std::char_traits<char>>>::ConvertToContainer<std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>,std::basic_string_view<char,std::char_traits<char>>,false>::TEMPNAMEPLACEHOLDERVALUE(absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByAnyChar,absl::lts_20250127::SkipEmpty,std::basic_string_view<char,std::char_traits<char>>>const&)const::raw_view,16ul>
                            *)&it.field_0x48);
      local_1e1 = 0;
      if (sVar5 != sVar6) {
        bVar1 = SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByAnyChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ::at_end((SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByAnyChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          *)local_178);
        local_1e1 = bVar1 ^ 0xff;
      }
    } while ((local_1e1 & 1) != 0);
    local_1a0._M_current =
         (basic_string_view<char,_std::char_traits<char>_> *)
         std::
         vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
         ::end(__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<std::basic_string_view<char,std::char_traits<char>>const*,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>
    ::__normal_iterator<std::basic_string_view<char,std::char_traits<char>>*>
              ((__normal_iterator<std::basic_string_view<char,std::char_traits<char>>const*,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>
                *)&local_198,&local_1a0);
    __first = std::array<raw_view,_16UL>::begin((array<raw_view,_16UL> *)&it.field_0x48);
    pvVar7 = std::array<raw_view,_16UL>::begin((array<raw_view,_16UL> *)&it.field_0x48);
    std::
    vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
    ::operator()((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  *)__return_storage_ptr__,local_198,__first,pvVar7 + local_190);
  }
  SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByAnyChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~SplitIterator((SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByAnyChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *)local_178);
  return __return_storage_ptr__;
}

Assistant:

std::vector<absl::string_view, A> operator()(
        const Splitter& splitter) const {
      struct raw_view {
        const char* data;
        size_t size;
        operator absl::string_view() const {  // NOLINT(runtime/explicit)
          return {data, size};
        }
      };
      std::vector<absl::string_view, A> v;
      std::array<raw_view, 16> ar;
      for (auto it = splitter.begin(); !it.at_end();) {
        size_t index = 0;
        do {
          ar[index].data = it->data();
          ar[index].size = it->size();
          ++it;
        } while (++index != ar.size() && !it.at_end());
        // We static_cast index to a signed type to work around overzealous
        // compiler warnings about signedness.
        v.insert(v.end(), ar.begin(),
                 ar.begin() + static_cast<ptrdiff_t>(index));
      }
      return v;
    }